

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

uint __thiscall anon_unknown.dwarf_14174cb::SADSkipTest::SAD(SADSkipTest *this,int block_idx)

{
  __tuple_element_t<2UL,_tuple<int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int),_int>_>
  *pp_Var1;
  undefined4 in_ESI;
  long in_RDI;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  uint8_t *reference;
  uint ret;
  RegisterStateCheckMMX local_36;
  uchar *local_18;
  uint local_10;
  
  local_18 = (uchar *)(**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI + 8,in_ESI);
  libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_36);
  testing::
  WithParamInterface<std::tuple<int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int),_int>_>
  ::GetParam();
  pp_Var1 = std::
            get<2ul,int,int,unsigned_int(*)(unsigned_char_const*,int,unsigned_char_const*,int),int>
                      ((tuple<int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int),_int>
                        *)0xc30d7e);
  local_10 = (**pp_Var1)((anonymous_namespace)::SADTestBase::source_data_,*(int *)(in_RDI + 0x2c),
                         local_18,*(int *)(in_RDI + 0x34));
  libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xc30db2);
  return local_10;
}

Assistant:

unsigned int SAD(int block_idx) {
    unsigned int ret;
    const uint8_t *const reference = GetReference(block_idx);

    API_REGISTER_STATE_CHECK(ret = GET_PARAM(2)(source_data_, source_stride_,
                                                reference, reference_stride_));
    return ret;
  }